

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

void __thiscall testing::TestInfo::~TestInfo(TestInfo *this)

{
  pointer pcVar1;
  pointer pcVar2;
  
  if (this->factory_ != (TestFactoryBase *)0x0) {
    (*this->factory_->_vptr_TestFactoryBase[1])();
  }
  std::vector<testing::TestProperty,_std::allocator<testing::TestProperty>_>::~vector
            (&(this->result_).test_properties_);
  std::vector<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>::~vector
            (&(this->result_).test_part_results_);
  internal::Mutex::~Mutex(&(this->result_).test_properites_mutex_);
  pcVar1 = (this->location_).file._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->location_).file.field_2) {
    operator_delete(pcVar1);
  }
  internal::
  scoped_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::reset(&this->value_param_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  internal::
  scoped_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::reset(&this->type_param_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  pcVar2 = (this->name_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != &(this->name_).field_2) {
    operator_delete(pcVar2);
  }
  pcVar2 = (this->test_case_name_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != &(this->test_case_name_).field_2) {
    operator_delete(pcVar2);
    return;
  }
  return;
}

Assistant:

TestInfo::~TestInfo() { delete factory_; }